

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

reference __thiscall
ft::
deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::at(deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     *this,size_type n)

{
  pointer pvVar1;
  ulong uVar2;
  out_of_range *this_00;
  ulong uVar3;
  
  if (this->m_size <= n) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"deque");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pvVar1 = (this->m_start).m_cur;
  uVar2 = ((long)pvVar1 - (long)(this->m_start).m_first >> 5) + n;
  if ((long)uVar2 < 0) {
    uVar3 = (long)uVar2 >> 3;
  }
  else {
    if (uVar2 < 8) {
      return pvVar1 + n;
    }
    uVar3 = uVar2 >> 3;
  }
  return (this->m_start).m_node[uVar3] + uVar2 + uVar3 * -8;
}

Assistant:

reference 		at(size_type n) {
		if (n >= this->size()) throw std::out_of_range("deque");
		return this->m_start[n];
	}